

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::do_report_error(format_func func,int error_code,char *message)

{
  char *__ptr;
  size_t __size;
  size_t sVar1;
  allocator<char> local_239;
  undefined1 local_238 [8];
  memory_buffer full_message;
  char *message_local;
  int error_code_local;
  format_func func_local;
  
  full_message._528_8_ = message;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_238,
             &local_239);
  (*func)((buffer<char> *)local_238,error_code,(char *)full_message._528_8_);
  __ptr = buffer<char>::data((buffer<char> *)local_238);
  __size = buffer<char>::size((buffer<char> *)local_238);
  sVar1 = fwrite(__ptr,__size,1,_stderr);
  if (sVar1 != 0) {
    fputc(10,_stderr);
  }
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_238);
  return;
}

Assistant:

FMT_FUNC void do_report_error(format_func func, int error_code,
                              const char* message) noexcept {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_all because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}